

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int whereLoopAddVirtualOne
              (WhereLoopBuilder *pBuilder,Bitmask mPrereq,Bitmask mUsable,u16 mExclude,
              sqlite3_index_info *pIdxInfo,u16 mNoOmit,int *pbIn,int *pbRetryLimit)

{
  u32 *puVar1;
  u16 *puVar2;
  byte *pbVar3;
  double dVar4;
  byte bVar5;
  int iVar6;
  WhereClause *pWVar7;
  sqlite3_index_constraint_usage *__s;
  WhereLoop *pTemplate;
  Parse *pParse;
  SrcList *pSVar8;
  Table *pTVar9;
  sqlite3_vtab *psVar10;
  sqlite3 *db;
  bool bVar11;
  i8 iVar12;
  LogEst LVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uchar *puVar17;
  ulong uVar18;
  VTable *pVVar19;
  WhereTerm *pWVar20;
  char *pcVar21;
  WhereLoop *pWVar22;
  int iVar23;
  ulong uVar24;
  int iVar25;
  ulong uVar26;
  sqlite3_index_constraint *psVar27;
  
  pWVar7 = pBuilder->pWC;
  __s = pIdxInfo->aConstraintUsage;
  pTemplate = pBuilder->pNew;
  pParse = pBuilder->pWInfo->pParse;
  pSVar8 = pBuilder->pWInfo->pTabList;
  bVar5 = pTemplate->iTab;
  iVar6 = pIdxInfo->nConstraint;
  uVar26 = (ulong)iVar6;
  *pbIn = 0;
  pTemplate->prereq = mPrereq;
  if (0 < (long)uVar26) {
    pWVar20 = pWVar7->a;
    puVar17 = &pIdxInfo->aConstraint->usable;
    iVar25 = iVar6;
    do {
      iVar23 = *(int *)(puVar17 + 3);
      *puVar17 = '\0';
      if ((((pWVar20[iVar23].prereqRight & ~mUsable) == 0) &&
          ((pWVar20[iVar23].eOperator & mExclude) == 0)) &&
         ((pbRetryLimit != (int *)0x0 || ((byte)(pWVar20[iVar23].eMatchOp + 0xb5) < 0xfe)))) {
        *puVar17 = '\x01';
      }
      puVar17 = puVar17 + 0xc;
      iVar25 = iVar25 + -1;
    } while (iVar25 != 0);
  }
  memset(__s,0,uVar26 * 8);
  pIdxInfo->idxStr = (char *)0x0;
  pIdxInfo->idxNum = 0;
  pIdxInfo->orderByConsumed = 0;
  pIdxInfo->estimatedCost = 5e+98;
  pIdxInfo->estimatedRows = 0x19;
  pIdxInfo->idxFlags = 0;
  pIdxInfo->colUsed = pSVar8->a[bVar5].colUsed;
  *(undefined4 *)&pIdxInfo[1].aOrderBy = 0;
  pTVar9 = pSVar8->a[bVar5].pTab;
  for (pVVar19 = (pTVar9->u).vtab.p; (pVVar19 != (VTable *)0x0 && (pVVar19->db != pParse->db));
      pVVar19 = pVVar19->pNext) {
  }
  psVar10 = pVVar19->pVtab;
  puVar1 = &pParse->db->nSchemaLock;
  *puVar1 = *puVar1 + 1;
  uVar14 = (*psVar10->pModule->xBestIndex)(psVar10,pIdxInfo);
  db = pParse->db;
  puVar1 = &db->nSchemaLock;
  *puVar1 = *puVar1 - 1;
  if ((uVar14 != 0) && (uVar14 != 0x13)) {
    if (uVar14 == 7) {
      sqlite3OomFault(db);
    }
    else {
      pcVar21 = psVar10->zErrMsg;
      if (pcVar21 == (char *)0x0) {
        if (uVar14 == 0x204) {
          pcVar21 = "abort due to ROLLBACK";
        }
        else if (uVar14 == 0x65) {
          pcVar21 = "no more rows available";
        }
        else if (uVar14 == 100) {
          pcVar21 = "another row available";
        }
        else {
          uVar16 = uVar14 & 0xff;
          pcVar21 = "unknown error";
          if ((uVar16 < 0x1d) && ((0x1410004UL >> ((ulong)uVar16 & 0x3f) & 1) == 0)) {
            pcVar21 = *(char **)(sqlite3ErrStr_aMsg + (ulong)uVar16 * 8);
          }
        }
      }
      sqlite3ErrorMsg(pParse,"%s",pcVar21);
    }
  }
  if (((pTVar9->u).vtab.p)->bAllSchemas != '\0') {
    iVar25 = pParse->db->nDb;
    if (0 < iVar25) {
      iVar23 = 0;
      do {
        sqlite3CodeVerifySchema(pParse,iVar23);
        iVar23 = iVar23 + 1;
      } while (iVar25 != iVar23);
    }
    if ((0 < iVar25) && (pParse->writeMask != 0)) {
      iVar23 = 0;
      do {
        sqlite3BeginWriteOperation(pParse,0,iVar23);
        iVar23 = iVar23 + 1;
      } while (iVar25 != iVar23);
    }
  }
  sqlite3_free(psVar10->zErrMsg);
  psVar10->zErrMsg = (char *)0x0;
  if (uVar14 == 0) {
    memset(pTemplate->aLTerm,0,uVar26 * 8);
    *(undefined8 *)&pTemplate->u = 0;
    (pTemplate->u).btree.pIndex = (Index *)0x0;
    *(undefined8 *)((long)&pTemplate->u + 0x10) = 0;
    if (iVar6 < 1) {
      uVar14 = 0xffffffff;
    }
    else {
      psVar27 = pIdxInfo->aConstraint;
      uVar14 = 0xffffffff;
      uVar24 = 0;
      pWVar22 = pTemplate;
      do {
        iVar25 = __s[uVar24].argvIndex;
        bVar11 = true;
        if (0 < iVar25) {
          if (iVar25 <= iVar6) {
            uVar16 = psVar27->iTermOffset;
            if ((-1 < (int)uVar16) && ((int)uVar16 < pWVar7->nTerm)) {
              uVar15 = iVar25 - 1;
              if ((pTemplate->aLTerm[uVar15] == (WhereTerm *)0x0) && (psVar27->usable != '\0')) {
                pWVar20 = pWVar7->a;
                pTemplate->prereq = pTemplate->prereq | pWVar20[uVar16].prereqRight;
                pWVar20 = pWVar20 + uVar16;
                pTemplate->aLTerm[uVar15] = pWVar20;
                if ((int)uVar14 < (int)uVar15) {
                  uVar14 = uVar15;
                }
                if (__s[uVar24].omit != '\0') {
                  if ((uVar24 < 0x10) && ((mNoOmit >> ((uint)uVar24 & 0x1f) & 1) == 0)) {
                    puVar2 = &(pTemplate->u).btree.nDistinctCol;
                    *puVar2 = *puVar2 | (ushort)(1 << ((byte)uVar15 & 0x1f));
                  }
                  if (pWVar20->eMatchOp == 'J') {
                    pbVar3 = (byte *)((long)&pTemplate->u + 4);
                    *pbVar3 = *pbVar3 | 2;
                  }
                }
                uVar16 = 1 << ((byte)uVar24 & 0x1f);
                if (0x1f < uVar24) {
                  uVar16 = 0;
                }
                if ((*(uint *)&pIdxInfo[1].aOrderBy & uVar16) == 0) {
                  if ((pWVar20->eOperator & 1) != 0) {
                    pIdxInfo->orderByConsumed = 0;
                    *(byte *)&pIdxInfo->idxFlags = (byte)pIdxInfo->idxFlags & 0xfe;
                    *pbIn = 1;
                  }
                }
                else {
                  puVar1 = &(pTemplate->u).vtab.mHandleIn;
                  *puVar1 = *puVar1 | 1 << ((byte)uVar15 & 0x1f);
                }
                if (0xfd < (byte)(pWVar20->eMatchOp + 0xb5)) {
                  if (*pbIn == 0) {
                    if (uVar24 != 0) {
                      uVar18 = 0;
                      do {
                        if (__s[uVar18].argvIndex < 1) goto LAB_0018df61;
                        uVar18 = uVar18 + 1;
                      } while (uVar24 != uVar18);
                    }
                  }
                  else {
LAB_0018df61:
                    if (pIdxInfo->needToFreeIdxStr != 0) {
                      sqlite3_free(pIdxInfo->idxStr);
                      pIdxInfo->idxStr = (char *)0x0;
                      pIdxInfo->needToFreeIdxStr = 0;
                    }
                    *pbRetryLimit = 1;
                    bVar11 = false;
                    pWVar22 = (WhereLoop *)0x0;
                  }
                }
                goto LAB_0018de6b;
              }
            }
          }
          bVar11 = false;
          sqlite3ErrorMsg(pParse,"%s.xBestIndex malfunction",(pSVar8->a[bVar5].pTab)->zName);
          pWVar22 = (WhereLoop *)0x1;
        }
LAB_0018de6b:
        if (!bVar11) {
          return (int)pWVar22;
        }
        uVar24 = uVar24 + 1;
        psVar27 = psVar27 + 1;
      } while (uVar24 != uVar26);
    }
    pTemplate->nLTerm = (u16)(uVar14 + 1);
    if (-1 < (int)uVar14) {
      uVar26 = 0;
      do {
        if (pTemplate->aLTerm[uVar26] == (WhereTerm *)0x0) {
          sqlite3ErrorMsg(pParse,"%s.xBestIndex malfunction",(pSVar8->a[bVar5].pTab)->zName);
          return 1;
        }
        uVar26 = uVar26 + 1;
      } while (uVar14 + 1 != uVar26);
    }
    (pTemplate->u).vtab.idxNum = pIdxInfo->idxNum;
    *(byte *)((long)&pTemplate->u + 4) =
         *(byte *)((long)&pTemplate->u + 4) & 0xfe | (byte)pIdxInfo->needToFreeIdxStr & 1;
    pIdxInfo->needToFreeIdxStr = 0;
    (pTemplate->u).btree.pIndex = (Index *)pIdxInfo->idxStr;
    if (pIdxInfo->orderByConsumed == 0) {
      iVar12 = '\0';
    }
    else {
      iVar12 = (i8)pIdxInfo->nOrderBy;
    }
    (pTemplate->u).vtab.isOrdered = iVar12;
    pTemplate->rSetup = 0;
    dVar4 = pIdxInfo->estimatedCost;
    if (dVar4 <= 1.0) {
      LVar13 = 0;
    }
    else if (dVar4 <= 2000000000.0) {
      LVar13 = sqlite3LogEst((long)(dVar4 - 9.223372036854776e+18) & (long)dVar4 >> 0x3f |
                             (long)dVar4);
    }
    else {
      LVar13 = (ushort)((ulong)dVar4 >> 0x34) * 10 + -0x27ec;
    }
    pTemplate->rRun = LVar13;
    LVar13 = sqlite3LogEst(pIdxInfo->estimatedRows);
    pTemplate->nOut = LVar13;
    pTemplate->wsFlags = (pIdxInfo->idxFlags & 1U) << 0xc | pTemplate->wsFlags & 0xffffefff;
    uVar16 = whereLoopInsert(pBuilder,pTemplate);
    if ((undefined1  [24])((undefined1  [24])pTemplate->u & (undefined1  [24])0x100000000) !=
        (undefined1  [24])0x0) {
      sqlite3_free((pTemplate->u).btree.pIndex);
      pbVar3 = (byte *)((long)&pTemplate->u + 4);
      *pbVar3 = *pbVar3 & 0xfe;
    }
  }
  else {
    uVar16 = 0;
    if (uVar14 != 0x13) {
      uVar16 = uVar14;
    }
  }
  return uVar16;
}

Assistant:

static int whereLoopAddVirtualOne(
  WhereLoopBuilder *pBuilder,
  Bitmask mPrereq,                /* Mask of tables that must be used. */
  Bitmask mUsable,                /* Mask of usable tables */
  u16 mExclude,                   /* Exclude terms using these operators */
  sqlite3_index_info *pIdxInfo,   /* Populated object for xBestIndex */
  u16 mNoOmit,                    /* Do not omit these constraints */
  int *pbIn,                      /* OUT: True if plan uses an IN(...) op */
  int *pbRetryLimit               /* OUT: Retry without LIMIT/OFFSET */
){
  WhereClause *pWC = pBuilder->pWC;
  HiddenIndexInfo *pHidden = (HiddenIndexInfo*)&pIdxInfo[1];
  struct sqlite3_index_constraint *pIdxCons;
  struct sqlite3_index_constraint_usage *pUsage = pIdxInfo->aConstraintUsage;
  int i;
  int mxTerm;
  int rc = SQLITE_OK;
  WhereLoop *pNew = pBuilder->pNew;
  Parse *pParse = pBuilder->pWInfo->pParse;
  SrcItem *pSrc = &pBuilder->pWInfo->pTabList->a[pNew->iTab];
  int nConstraint = pIdxInfo->nConstraint;

  assert( (mUsable & mPrereq)==mPrereq );
  *pbIn = 0;
  pNew->prereq = mPrereq;

  /* Set the usable flag on the subset of constraints identified by
  ** arguments mUsable and mExclude. */
  pIdxCons = *(struct sqlite3_index_constraint**)&pIdxInfo->aConstraint;
  for(i=0; i<nConstraint; i++, pIdxCons++){
    WhereTerm *pTerm = &pWC->a[pIdxCons->iTermOffset];
    pIdxCons->usable = 0;
    if( (pTerm->prereqRight & mUsable)==pTerm->prereqRight
     && (pTerm->eOperator & mExclude)==0
     && (pbRetryLimit || !isLimitTerm(pTerm))
    ){
      pIdxCons->usable = 1;
    }
  }

  /* Initialize the output fields of the sqlite3_index_info structure */
  memset(pUsage, 0, sizeof(pUsage[0])*nConstraint);
  assert( pIdxInfo->needToFreeIdxStr==0 );
  pIdxInfo->idxStr = 0;
  pIdxInfo->idxNum = 0;
  pIdxInfo->orderByConsumed = 0;
  pIdxInfo->estimatedCost = SQLITE_BIG_DBL / (double)2;
  pIdxInfo->estimatedRows = 25;
  pIdxInfo->idxFlags = 0;
  pIdxInfo->colUsed = (sqlite3_int64)pSrc->colUsed;
  pHidden->mHandleIn = 0;

  /* Invoke the virtual table xBestIndex() method */
  rc = vtabBestIndex(pParse, pSrc->pTab, pIdxInfo);
  if( rc ){
    if( rc==SQLITE_CONSTRAINT ){
      /* If the xBestIndex method returns SQLITE_CONSTRAINT, that means
      ** that the particular combination of parameters provided is unusable.
      ** Make no entries in the loop table.
      */
      WHERETRACE(0xffffffff, ("  ^^^^--- non-viable plan rejected!\n"));
      return SQLITE_OK;
    }
    return rc;
  }

  mxTerm = -1;
  assert( pNew->nLSlot>=nConstraint );
  memset(pNew->aLTerm, 0, sizeof(pNew->aLTerm[0])*nConstraint );
  memset(&pNew->u.vtab, 0, sizeof(pNew->u.vtab));
  pIdxCons = *(struct sqlite3_index_constraint**)&pIdxInfo->aConstraint;
  for(i=0; i<nConstraint; i++, pIdxCons++){
    int iTerm;
    if( (iTerm = pUsage[i].argvIndex - 1)>=0 ){
      WhereTerm *pTerm;
      int j = pIdxCons->iTermOffset;
      if( iTerm>=nConstraint
       || j<0
       || j>=pWC->nTerm
       || pNew->aLTerm[iTerm]!=0
       || pIdxCons->usable==0
      ){
        sqlite3ErrorMsg(pParse,"%s.xBestIndex malfunction",pSrc->pTab->zName);
        testcase( pIdxInfo->needToFreeIdxStr );
        return SQLITE_ERROR;
      }
      testcase( iTerm==nConstraint-1 );
      testcase( j==0 );
      testcase( j==pWC->nTerm-1 );
      pTerm = &pWC->a[j];
      pNew->prereq |= pTerm->prereqRight;
      assert( iTerm<pNew->nLSlot );
      pNew->aLTerm[iTerm] = pTerm;
      if( iTerm>mxTerm ) mxTerm = iTerm;
      testcase( iTerm==15 );
      testcase( iTerm==16 );
      if( pUsage[i].omit ){
        if( i<16 && ((1<<i)&mNoOmit)==0 ){
          testcase( i!=iTerm );
          pNew->u.vtab.omitMask |= 1<<iTerm;
        }else{
          testcase( i!=iTerm );
        }
        if( pTerm->eMatchOp==SQLITE_INDEX_CONSTRAINT_OFFSET ){
          pNew->u.vtab.bOmitOffset = 1;
        }
      }
      if( SMASKBIT32(i) & pHidden->mHandleIn ){
        pNew->u.vtab.mHandleIn |= MASKBIT32(iTerm);
      }else if( (pTerm->eOperator & WO_IN)!=0 ){
        /* A virtual table that is constrained by an IN clause may not
        ** consume the ORDER BY clause because (1) the order of IN terms
        ** is not necessarily related to the order of output terms and
        ** (2) Multiple outputs from a single IN value will not merge
        ** together.  */
        pIdxInfo->orderByConsumed = 0;
        pIdxInfo->idxFlags &= ~SQLITE_INDEX_SCAN_UNIQUE;
        *pbIn = 1; assert( (mExclude & WO_IN)==0 );
      }

      /* Unless pbRetryLimit is non-NULL, there should be no LIMIT/OFFSET
      ** terms. And if there are any, they should follow all other terms. */
      assert( pbRetryLimit || !isLimitTerm(pTerm) );
      assert( !isLimitTerm(pTerm) || i>=nConstraint-2 );
      assert( !isLimitTerm(pTerm) || i==nConstraint-1 || isLimitTerm(pTerm+1) );

      if( isLimitTerm(pTerm) && (*pbIn || !allConstraintsUsed(pUsage, i)) ){
        /* If there is an IN(...) term handled as an == (separate call to
        ** xFilter for each value on the RHS of the IN) and a LIMIT or
        ** OFFSET term handled as well, the plan is unusable. Similarly,
        ** if there is a LIMIT/OFFSET and there are other unused terms,
        ** the plan cannot be used. In these cases set variable *pbRetryLimit
        ** to true to tell the caller to retry with LIMIT and OFFSET
        ** disabled. */
        if( pIdxInfo->needToFreeIdxStr ){
          sqlite3_free(pIdxInfo->idxStr);
          pIdxInfo->idxStr = 0;
          pIdxInfo->needToFreeIdxStr = 0;
        }
        *pbRetryLimit = 1;
        return SQLITE_OK;
      }
    }
  }

  pNew->nLTerm = mxTerm+1;
  for(i=0; i<=mxTerm; i++){
    if( pNew->aLTerm[i]==0 ){
      /* The non-zero argvIdx values must be contiguous.  Raise an
      ** error if they are not */
      sqlite3ErrorMsg(pParse,"%s.xBestIndex malfunction",pSrc->pTab->zName);
      testcase( pIdxInfo->needToFreeIdxStr );
      return SQLITE_ERROR;
    }
  }
  assert( pNew->nLTerm<=pNew->nLSlot );
  pNew->u.vtab.idxNum = pIdxInfo->idxNum;
  pNew->u.vtab.needFree = pIdxInfo->needToFreeIdxStr;
  pIdxInfo->needToFreeIdxStr = 0;
  pNew->u.vtab.idxStr = pIdxInfo->idxStr;
  pNew->u.vtab.isOrdered = (i8)(pIdxInfo->orderByConsumed ?
      pIdxInfo->nOrderBy : 0);
  pNew->rSetup = 0;
  pNew->rRun = sqlite3LogEstFromDouble(pIdxInfo->estimatedCost);
  pNew->nOut = sqlite3LogEst(pIdxInfo->estimatedRows);

  /* Set the WHERE_ONEROW flag if the xBestIndex() method indicated
  ** that the scan will visit at most one row. Clear it otherwise. */
  if( pIdxInfo->idxFlags & SQLITE_INDEX_SCAN_UNIQUE ){
    pNew->wsFlags |= WHERE_ONEROW;
  }else{
    pNew->wsFlags &= ~WHERE_ONEROW;
  }
  rc = whereLoopInsert(pBuilder, pNew);
  if( pNew->u.vtab.needFree ){
    sqlite3_free(pNew->u.vtab.idxStr);
    pNew->u.vtab.needFree = 0;
  }
  WHERETRACE(0xffffffff, ("  bIn=%d prereqIn=%04llx prereqOut=%04llx\n",
                      *pbIn, (sqlite3_uint64)mPrereq,
                      (sqlite3_uint64)(pNew->prereq & ~mPrereq)));

  return rc;
}